

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::MediaAccumulator::
try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
          (MediaAccumulator *this,IntType platforms,char *extension)

{
  bool bVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  undefined1 local_30 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (this + 0x70),(char *)CONCAT44(in_register_00000034,platforms));
  if (bVar1) {
    std::make_shared<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>,void>
              ((__shared_ptr<Storage::Disk::Disk,(__gnu_cxx::_Lock_policy)2> *)(local_30 + 0x10),
               (__shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>,_(__gnu_cxx::_Lock_policy)2>
                *)local_30);
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)this,(shared_ptr<Storage::Disk::Disk> *)(local_30 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    **(uint **)(this + 0x68) = **(uint **)(this + 0x68) | 0x760;
    if ((pointer)local_30._0_8_ != (pointer)0x0) {
      uVar2 = (*(code *)**(undefined8 **)(local_30._0_8_ + 0x70))((pointer)(local_30._0_8_ + 0x70));
      **(uint **)(this + 0x68) = **(uint **)(this + 0x68) & uVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  }
  return;
}

Assistant:

void try_standard(TargetPlatform::IntType platforms, const char *extension) {
		if(name_matches(extension))	{
			try_insert<InstanceT>(platforms, file_name_);
		}
	}